

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLstack.c
# Opt level: O0

void RDL_stack_pop(RDL_stack *stack)

{
  void **ppvVar1;
  void **ppvVar2;
  void **ppvVar3;
  uint distance;
  RDL_stack *stack_local;
  
  if (stack->size != 0) {
    stack->size = stack->size - 1;
    stack->top = stack->top + -1;
    if ((stack->size << 1 < stack->reserved) && (0x20 < stack->reserved)) {
      ppvVar1 = stack->top;
      ppvVar2 = stack->elements;
      stack->reserved = stack->reserved >> 1;
      ppvVar3 = (void **)realloc(stack->elements,(ulong)stack->reserved << 3);
      stack->elements = ppvVar3;
      stack->top = stack->elements + ((long)ppvVar1 - (long)ppvVar2 >> 3 & 0xffffffff);
    }
  }
  return;
}

Assistant:

void RDL_stack_pop(RDL_stack* stack)
{
  unsigned distance;

  if (stack->size > 0) {
    --stack->size;
    --stack->top;

    if (stack->size * 2 < stack->reserved && stack->reserved > MinSize) {
      distance = stack->top - stack->elements;

      stack->reserved = stack->reserved / 2;

      stack->elements = realloc(stack->elements,
          stack->reserved * sizeof(*stack->elements));

      stack->top = stack->elements + distance;
    }
  }
}